

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

void MirrorPlane(uint8_t *src_y,int src_stride_y,uint8_t *dst_y,int dst_stride_y,int width,
                int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  
  iVar1 = height;
  if (height < 0) {
    iVar1 = -height;
    src_y = src_y + ~height * src_stride_y;
    src_stride_y = -src_stride_y;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((width & 0xfU) == 0) {
    pcVar4 = MirrorRow_SSSE3;
  }
  else {
    pcVar4 = MirrorRow_Any_SSSE3;
  }
  if ((uVar2 & 0x40) == 0) {
    pcVar4 = MirrorRow_C;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((width & 0x1fU) == 0) {
    pcVar3 = MirrorRow_AVX2;
  }
  else {
    pcVar3 = MirrorRow_Any_AVX2;
  }
  if ((uVar2 >> 10 & 1) == 0) {
    pcVar3 = pcVar4;
  }
  if (0 < iVar1) {
    do {
      (*pcVar3)(src_y,dst_y,width);
      src_y = src_y + src_stride_y;
      dst_y = dst_y + dst_stride_y;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

LIBYUV_API
void MirrorPlane(const uint8_t* src_y,
                 int src_stride_y,
                 uint8_t* dst_y,
                 int dst_stride_y,
                 int width,
                 int height) {
  int y;
  void (*MirrorRow)(const uint8_t* src, uint8_t* dst, int width) = MirrorRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }
#if defined(HAS_MIRRORROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    MirrorRow = MirrorRow_Any_NEON;
    if (IS_ALIGNED(width, 32)) {
      MirrorRow = MirrorRow_NEON;
    }
  }
#endif
#if defined(HAS_MIRRORROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    MirrorRow = MirrorRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      MirrorRow = MirrorRow_SSSE3;
    }
  }
#endif
#if defined(HAS_MIRRORROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    MirrorRow = MirrorRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      MirrorRow = MirrorRow_AVX2;
    }
  }
#endif
#if defined(HAS_MIRRORROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    MirrorRow = MirrorRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      MirrorRow = MirrorRow_MMI;
    }
  }
#endif
#if defined(HAS_MIRRORROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    MirrorRow = MirrorRow_Any_MSA;
    if (IS_ALIGNED(width, 64)) {
      MirrorRow = MirrorRow_MSA;
    }
  }
#endif

  // Mirror plane
  for (y = 0; y < height; ++y) {
    MirrorRow(src_y, dst_y, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
}